

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 451.hpp
# Opt level: O1

void __thiscall
std::__detail::__variant::
__variant_construct_single<std::__detail::__variant::_Move_ctor_base<false,njoy::ENDFtk::section::Type<1,451>,njoy::ENDFtk::section::Type<1,452>,njoy::ENDFtk::section::Type<1,455>,njoy::ENDFtk::section::Type<1,456>,njoy::ENDFtk::section::Type<1,458>,njoy::ENDFtk::section::Type<1,460>>&,njoy::ENDFtk::section::Type<1,451>>
          (_Move_ctor_base<false,_njoy::ENDFtk::section::Type<1,_451>,_njoy::ENDFtk::section::Type<1,_452>,_njoy::ENDFtk::section::Type<1,_455>,_njoy::ENDFtk::section::Type<1,_456>,_njoy::ENDFtk::section::Type<1,_458>,_njoy::ENDFtk::section::Type<1,_460>_>
           *__lhs,Type<1,_451> *__rhs_mem)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  double dVar3;
  undefined8 uVar4;
  pointer pTVar5;
  pointer pDVar6;
  long lVar7;
  
  dVar3 = (__rhs_mem->super_BaseWithoutMT<njoy::ENDFtk::section::Type<1,_451>_>).atomicWeightRatio_;
  *(undefined8 *)
   &(__lhs->
    super__Copy_ctor_alias<njoy::ENDFtk::section::Type<1,_451>,_njoy::ENDFtk::section::Type<1,_452>,_njoy::ENDFtk::section::Type<1,_455>,_njoy::ENDFtk::section::Type<1,_456>,_njoy::ENDFtk::section::Type<1,_458>,_njoy::ENDFtk::section::Type<1,_460>_>
    ).
    super__Variant_storage_alias<njoy::ENDFtk::section::Type<1,_451>,_njoy::ENDFtk::section::Type<1,_452>,_njoy::ENDFtk::section::Type<1,_455>,_njoy::ENDFtk::section::Type<1,_456>,_njoy::ENDFtk::section::Type<1,_458>,_njoy::ENDFtk::section::Type<1,_460>_>
    ._M_u = *(undefined8 *)&__rhs_mem->super_BaseWithoutMT<njoy::ENDFtk::section::Type<1,_451>_>;
  *(double *)
   ((long)&(__lhs->
           super__Copy_ctor_alias<njoy::ENDFtk::section::Type<1,_451>,_njoy::ENDFtk::section::Type<1,_452>,_njoy::ENDFtk::section::Type<1,_455>,_njoy::ENDFtk::section::Type<1,_456>,_njoy::ENDFtk::section::Type<1,_458>,_njoy::ENDFtk::section::Type<1,_460>_>
           ).
           super__Variant_storage_alias<njoy::ENDFtk::section::Type<1,_451>,_njoy::ENDFtk::section::Type<1,_452>,_njoy::ENDFtk::section::Type<1,_455>,_njoy::ENDFtk::section::Type<1,_456>,_njoy::ENDFtk::section::Type<1,_458>,_njoy::ENDFtk::section::Type<1,_460>_>
           ._M_u + 8) = dVar3;
  uVar4 = *(undefined8 *)&__rhs_mem->nlib_;
  *(undefined8 *)
   ((long)&(__lhs->
           super__Copy_ctor_alias<njoy::ENDFtk::section::Type<1,_451>,_njoy::ENDFtk::section::Type<1,_452>,_njoy::ENDFtk::section::Type<1,_455>,_njoy::ENDFtk::section::Type<1,_456>,_njoy::ENDFtk::section::Type<1,_458>,_njoy::ENDFtk::section::Type<1,_460>_>
           ).
           super__Variant_storage_alias<njoy::ENDFtk::section::Type<1,_451>,_njoy::ENDFtk::section::Type<1,_452>,_njoy::ENDFtk::section::Type<1,_455>,_njoy::ENDFtk::section::Type<1,_456>,_njoy::ENDFtk::section::Type<1,_458>,_njoy::ENDFtk::section::Type<1,_460>_>
           ._M_u + 0x10) = *(undefined8 *)&__rhs_mem->lrp_;
  *(undefined8 *)
   ((long)&(__lhs->
           super__Copy_ctor_alias<njoy::ENDFtk::section::Type<1,_451>,_njoy::ENDFtk::section::Type<1,_452>,_njoy::ENDFtk::section::Type<1,_455>,_njoy::ENDFtk::section::Type<1,_456>,_njoy::ENDFtk::section::Type<1,_458>,_njoy::ENDFtk::section::Type<1,_460>_>
           ).
           super__Variant_storage_alias<njoy::ENDFtk::section::Type<1,_451>,_njoy::ENDFtk::section::Type<1,_452>,_njoy::ENDFtk::section::Type<1,_455>,_njoy::ENDFtk::section::Type<1,_456>,_njoy::ENDFtk::section::Type<1,_458>,_njoy::ENDFtk::section::Type<1,_460>_>
           ._M_u + 0x18) = uVar4;
  lVar7 = 0x48;
  do {
    *(undefined8 *)((long)__lhs + lVar7 + -0x28) =
         *(undefined8 *)((long)(__rhs_mem->parameters_)._M_elems + lVar7 + -0x48);
    *(undefined8 *)((long)__lhs + lVar7 + -0x20) =
         *(undefined8 *)((long)(__rhs_mem->parameters_)._M_elems + lVar7 + -0x40);
    *(undefined8 *)((long)__lhs + lVar7 + -0x18) =
         *(undefined8 *)((long)(__rhs_mem->parameters_)._M_elems + lVar7 + -0x38);
    puVar1 = (undefined8 *)((long)((__rhs_mem->parameters_)._M_elems + -1) + lVar7);
    uVar4 = puVar1[1];
    puVar2 = (undefined8 *)((long)__lhs + lVar7 + -0x10);
    *puVar2 = *puVar1;
    puVar2[1] = uVar4;
    *(undefined8 *)
     ((long)&(__lhs->
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<1,_451>,_njoy::ENDFtk::section::Type<1,_452>,_njoy::ENDFtk::section::Type<1,_455>,_njoy::ENDFtk::section::Type<1,_456>,_njoy::ENDFtk::section::Type<1,_458>,_njoy::ENDFtk::section::Type<1,_460>_>
             ).
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<1,_451>,_njoy::ENDFtk::section::Type<1,_452>,_njoy::ENDFtk::section::Type<1,_455>,_njoy::ENDFtk::section::Type<1,_456>,_njoy::ENDFtk::section::Type<1,_458>,_njoy::ENDFtk::section::Type<1,_460>_>
             ._M_u + lVar7) =
         *(undefined8 *)((long)(__rhs_mem->parameters_)._M_elems + lVar7 + -0x20);
    lVar7 = lVar7 + 0x30;
  } while (lVar7 != 0xd8);
  pTVar5 = (__rhs_mem->description_).
           super__Vector_base<njoy::ENDFtk::TextRecord,_std::allocator<njoy::ENDFtk::TextRecord>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  *(pointer *)
   ((long)&(__lhs->
           super__Copy_ctor_alias<njoy::ENDFtk::section::Type<1,_451>,_njoy::ENDFtk::section::Type<1,_452>,_njoy::ENDFtk::section::Type<1,_455>,_njoy::ENDFtk::section::Type<1,_456>,_njoy::ENDFtk::section::Type<1,_458>,_njoy::ENDFtk::section::Type<1,_460>_>
           ).
           super__Variant_storage_alias<njoy::ENDFtk::section::Type<1,_451>,_njoy::ENDFtk::section::Type<1,_452>,_njoy::ENDFtk::section::Type<1,_455>,_njoy::ENDFtk::section::Type<1,_456>,_njoy::ENDFtk::section::Type<1,_458>,_njoy::ENDFtk::section::Type<1,_460>_>
           ._M_u + 0xb0) =
       (__rhs_mem->description_).
       super__Vector_base<njoy::ENDFtk::TextRecord,_std::allocator<njoy::ENDFtk::TextRecord>_>.
       _M_impl.super__Vector_impl_data._M_start;
  *(pointer *)
   ((long)&(__lhs->
           super__Copy_ctor_alias<njoy::ENDFtk::section::Type<1,_451>,_njoy::ENDFtk::section::Type<1,_452>,_njoy::ENDFtk::section::Type<1,_455>,_njoy::ENDFtk::section::Type<1,_456>,_njoy::ENDFtk::section::Type<1,_458>,_njoy::ENDFtk::section::Type<1,_460>_>
           ).
           super__Variant_storage_alias<njoy::ENDFtk::section::Type<1,_451>,_njoy::ENDFtk::section::Type<1,_452>,_njoy::ENDFtk::section::Type<1,_455>,_njoy::ENDFtk::section::Type<1,_456>,_njoy::ENDFtk::section::Type<1,_458>,_njoy::ENDFtk::section::Type<1,_460>_>
           ._M_u + 0xb8) = pTVar5;
  *(pointer *)
   ((long)&(__lhs->
           super__Copy_ctor_alias<njoy::ENDFtk::section::Type<1,_451>,_njoy::ENDFtk::section::Type<1,_452>,_njoy::ENDFtk::section::Type<1,_455>,_njoy::ENDFtk::section::Type<1,_456>,_njoy::ENDFtk::section::Type<1,_458>,_njoy::ENDFtk::section::Type<1,_460>_>
           ).
           super__Variant_storage_alias<njoy::ENDFtk::section::Type<1,_451>,_njoy::ENDFtk::section::Type<1,_452>,_njoy::ENDFtk::section::Type<1,_455>,_njoy::ENDFtk::section::Type<1,_456>,_njoy::ENDFtk::section::Type<1,_458>,_njoy::ENDFtk::section::Type<1,_460>_>
           ._M_u + 0xc0) =
       (__rhs_mem->description_).
       super__Vector_base<njoy::ENDFtk::TextRecord,_std::allocator<njoy::ENDFtk::TextRecord>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (__rhs_mem->description_).
  super__Vector_base<njoy::ENDFtk::TextRecord,_std::allocator<njoy::ENDFtk::TextRecord>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__rhs_mem->description_).
  super__Vector_base<njoy::ENDFtk::TextRecord,_std::allocator<njoy::ENDFtk::TextRecord>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__rhs_mem->description_).
  super__Vector_base<njoy::ENDFtk::TextRecord,_std::allocator<njoy::ENDFtk::TextRecord>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pDVar6 = (__rhs_mem->index_).
           super__Vector_base<njoy::ENDFtk::DirectoryRecord,_std::allocator<njoy::ENDFtk::DirectoryRecord>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  *(pointer *)
   ((long)&(__lhs->
           super__Copy_ctor_alias<njoy::ENDFtk::section::Type<1,_451>,_njoy::ENDFtk::section::Type<1,_452>,_njoy::ENDFtk::section::Type<1,_455>,_njoy::ENDFtk::section::Type<1,_456>,_njoy::ENDFtk::section::Type<1,_458>,_njoy::ENDFtk::section::Type<1,_460>_>
           ).
           super__Variant_storage_alias<njoy::ENDFtk::section::Type<1,_451>,_njoy::ENDFtk::section::Type<1,_452>,_njoy::ENDFtk::section::Type<1,_455>,_njoy::ENDFtk::section::Type<1,_456>,_njoy::ENDFtk::section::Type<1,_458>,_njoy::ENDFtk::section::Type<1,_460>_>
           ._M_u + 200) =
       (__rhs_mem->index_).
       super__Vector_base<njoy::ENDFtk::DirectoryRecord,_std::allocator<njoy::ENDFtk::DirectoryRecord>_>
       ._M_impl.super__Vector_impl_data._M_start;
  *(pointer *)
   ((long)&(__lhs->
           super__Copy_ctor_alias<njoy::ENDFtk::section::Type<1,_451>,_njoy::ENDFtk::section::Type<1,_452>,_njoy::ENDFtk::section::Type<1,_455>,_njoy::ENDFtk::section::Type<1,_456>,_njoy::ENDFtk::section::Type<1,_458>,_njoy::ENDFtk::section::Type<1,_460>_>
           ).
           super__Variant_storage_alias<njoy::ENDFtk::section::Type<1,_451>,_njoy::ENDFtk::section::Type<1,_452>,_njoy::ENDFtk::section::Type<1,_455>,_njoy::ENDFtk::section::Type<1,_456>,_njoy::ENDFtk::section::Type<1,_458>,_njoy::ENDFtk::section::Type<1,_460>_>
           ._M_u + 0xd0) = pDVar6;
  *(pointer *)
   ((long)&(__lhs->
           super__Copy_ctor_alias<njoy::ENDFtk::section::Type<1,_451>,_njoy::ENDFtk::section::Type<1,_452>,_njoy::ENDFtk::section::Type<1,_455>,_njoy::ENDFtk::section::Type<1,_456>,_njoy::ENDFtk::section::Type<1,_458>,_njoy::ENDFtk::section::Type<1,_460>_>
           ).
           super__Variant_storage_alias<njoy::ENDFtk::section::Type<1,_451>,_njoy::ENDFtk::section::Type<1,_452>,_njoy::ENDFtk::section::Type<1,_455>,_njoy::ENDFtk::section::Type<1,_456>,_njoy::ENDFtk::section::Type<1,_458>,_njoy::ENDFtk::section::Type<1,_460>_>
           ._M_u + 0xd8) =
       (__rhs_mem->index_).
       super__Vector_base<njoy::ENDFtk::DirectoryRecord,_std::allocator<njoy::ENDFtk::DirectoryRecord>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (__rhs_mem->index_).
  super__Vector_base<njoy::ENDFtk::DirectoryRecord,_std::allocator<njoy::ENDFtk::DirectoryRecord>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__rhs_mem->index_).
  super__Vector_base<njoy::ENDFtk::DirectoryRecord,_std::allocator<njoy::ENDFtk::DirectoryRecord>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__rhs_mem->index_).
  super__Vector_base<njoy::ENDFtk::DirectoryRecord,_std::allocator<njoy::ENDFtk::DirectoryRecord>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  return;
}

Assistant:

class ENDFTK_PYTHON_EXPORT Type< 1, 451 > : 
    protected BaseWithoutMT< Type< 1, 451 > > {

    friend BaseWithoutMT< Type< 1, 451 > >;

    /* fields */
    int lrp_;
    int lfi_;
    int nlib_;
    int nmod_;
    std::array< ControlRecord, 3 > parameters_;
    std::vector< TextRecord > description_;
    std::vector< DirectoryRecord > index_;

    /* auxiliary functions */
    #include "ENDFtk/section/1/451/src/makeParameters.hpp"
    #include "ENDFtk/section/1/451/src/makeDescription.hpp"
    #include "ENDFtk/section/1/451/src/readParameters.hpp"

  public:

    /* constructor */
    #include "ENDFtk/section/1/451/src/ctor.hpp"

    /* methods */

    /**
     *  @brief Return the resonance parameter flag
     */
    int LRP() const { return this->lrp_; }

    /**
     *  @brief Return the resonance parameter flag
     */
    int resonanceParameterFlag() const { return this->LRP(); }

    /**
     *  @brief Return the fissile flag
     */
    int LFI() const { return this->lfi_; }

    /**
     *  @brief Return the fissile flag
     */
    bool isFissile() const { return this->LFI(); }

    /**
     *  @brief Return the library type
     */
    int NLIB() const { return this->nlib_; }

    /**
     *  @brief Return the library type
     */
    int libraryType() const { return this->NLIB(); }

    /**
     *  @brief Return the modification number
     */
    int NMOD() const { return this->nmod_; }

    /**
     *  @brief Return the modification number
     */
    int modificationNumber() const { return this->NMOD(); }

    /**
     *  @brief Return the excitation energy
     */
    double ELIS() const { return std::get< 0 >( this->parameters_ ).C1(); }

    /**
     *  @brief Return the excitation energy
     */
    double excitationEnergy() const { return this->ELIS(); }

    /**
     *  @brief Return the stability flag
     */
    double STA() const { return std::get< 0 >( this->parameters_ ).C2(); }

    /**
     *  @brief Return the stability flag
     */
    bool isStable() const { return this->STA(); }

    /**
     *  @brief Return the excited level number
     */
    int LIS() const { return std::get< 0 >( this->parameters_ ).L1(); }

    /**
     *  @brief Return the excited level number
     */
    int excitedLevel() const { return this->LIS(); }

    /**
     *  @brief Return the isomeric state number
     */
    int LISO() const { return std::get< 0 >( this->parameters_ ).L2(); }

    /**
     *  @brief Return the isomeric state number
     */
    int isomericLevel() const { return this->LISO(); }

    /**
     *  @brief Return the library format version number
     */
    int NFOR() const { return std::get< 0 >( this->parameters_ ).N2(); }

    /**
     *  @brief Return the library format version number
     */
    int libraryFormat() const { return this->NFOR(); }

    /**
     *  @brief Return the atomic weight ratio of the incident particle
     */
    double AWI() const { return std::get< 1 >( this->parameters_ ).C1(); }

    /**
     *  @brief Return the atomic weight ratio of the incident particle
     */
    double projectileAtomicMassRatio() const { return this->AWI(); }

    /**
     *  @brief Return the maximum energy
     */
    double EMAX() const { return std::get< 1 >( this->parameters_ ).C2(); }

    /**
     *  @brief Return the maximum energy
     */
    double maximumEnergy() const { return this->EMAX(); }

    /**
     *  @brief Return the release number
     */
    int LREL() const { return std::get< 1 >( this->parameters_ ).L1(); }

    /**
     *  @brief Return the release number
     */
    int releaseNumber() const { return this->LREL(); }

    /**
     *  @brief Return the sublibrary number
     */
    int NSUB() const { return std::get< 1 >( this->parameters_ ).N1(); }

    /**
     *  @brief Return the sublibrary number
     */
    int subLibrary() const { return this->NSUB(); }

    /**
     *  @brief Return the version number
     */
    int NVER() const { return std::get< 1 >( this->parameters_ ).N2(); }

    /**
     *  @brief Return the version number
     */
    int versionNumber() const { return this->NVER(); }

    /**
     *  @brief Return the temperature
     */
    double TEMP() const { return std::get< 2 >( this->parameters_ ).C1(); }

    /**
     *  @brief Return the temperature
     */
    double temperature() const { return this->TEMP(); }

    /**
     *  @brief Return the reconstruction tolerance
     */
    double RTOL() const { return std::get< 2 >( this->parameters_ ).C2(); }

    /**
     *  @brief Return the reconstruction tolerance
     */
    double reconstructionTolerance() const { return this->RTOL(); }

    /**
     *  @brief Return the derived material flag
     */
    int LDRV() const { return std::get< 2 >( this->parameters_ ).L1(); }

    /**
     *  @brief Return the derived material flag
     */
    int derivedMaterial() const { return this->LDRV(); }

    /**
     *  @brief Return the number of lines of descriptive data
     */
    int NWD() const { return static_cast< int >( this->description_.size() ); }

    /**
     *  @brief Return the number of index entries
     */
    int NXC() const { return static_cast< int >( this->index_.size() ); }

    /**
     *  @brief Return the index of available files and sections
     */
    auto index() const {

      return ranges::cpp20::views::all( this->index_ );
    }

    /**
     *  @brief Return the number of lines in this MF1/MT451 section
     */
    long NC() const { return 4 + this->NWD() + this->NXC(); }

    #include "ENDFtk/section/1/451/src/description.hpp"
    #include "ENDFtk/section/1/451/src/print.hpp"

    /**
     *  @brief Return the MT number of the section
     */
    static constexpr int sectionNumber() { return 451; }

    using BaseWithoutMT::MT;
    using BaseWithoutMT::ZA;
    using BaseWithoutMT::targetIdentifier;
    using BaseWithoutMT::AWR;
    using BaseWithoutMT::atomicWeightRatio;
  }